

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackinghelpers.h
# Opt level: O2

void duckdb_fastpforlib::internal::fastpack_half(uint16_t *in,uint16_t *out,uint32_t bit)

{
  logic_error *this;
  
  switch(bit) {
  case 0:
    __fastpack0(in,out);
    return;
  case 1:
    __fastpack1(in,out);
    return;
  case 2:
    __fastpack2(in,out);
    return;
  case 3:
    __fastpack3(in,out);
    return;
  case 4:
    __fastpack4(in,out);
    return;
  case 5:
    __fastpack5(in,out);
    return;
  case 6:
    __fastpack6(in,out);
    return;
  case 7:
    __fastpack7(in,out);
    return;
  case 8:
    __fastpack8(in,out);
    return;
  case 9:
    __fastpack9(in,out);
    return;
  case 10:
    __fastpack10(in,out);
    return;
  case 0xb:
    __fastpack11(in,out);
    return;
  case 0xc:
    __fastpack12(in,out);
    return;
  case 0xd:
    __fastpack13(in,out);
    return;
  case 0xe:
    __fastpack14(in,out);
    return;
  case 0xf:
    __fastpack15(in,out);
    return;
  case 0x10:
    __fastpack16(in,out);
    return;
  default:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Invalid bit width for bitpacking");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
}

Assistant:

inline void fastpack_half(const uint16_t *__restrict in, uint16_t *__restrict out, const uint32_t bit) {
	// Could have used function pointers instead of switch.
	// Switch calls do offer the compiler more opportunities for optimization in
	// theory. In this case, it makes no difference with a good compiler.
	switch (bit) {
	case 0:
		internal::__fastpack0(in, out);
		break;
	case 1:
		internal::__fastpack1(in, out);
		break;
	case 2:
		internal::__fastpack2(in, out);
		break;
	case 3:
		internal::__fastpack3(in, out);
		break;
	case 4:
		internal::__fastpack4(in, out);
		break;
	case 5:
		internal::__fastpack5(in, out);
		break;
	case 6:
		internal::__fastpack6(in, out);
		break;
	case 7:
		internal::__fastpack7(in, out);
		break;
	case 8:
		internal::__fastpack8(in, out);
		break;
	case 9:
		internal::__fastpack9(in, out);
		break;
	case 10:
		internal::__fastpack10(in, out);
		break;
	case 11:
		internal::__fastpack11(in, out);
		break;
	case 12:
		internal::__fastpack12(in, out);
		break;
	case 13:
		internal::__fastpack13(in, out);
		break;
	case 14:
		internal::__fastpack14(in, out);
		break;
	case 15:
		internal::__fastpack15(in, out);
		break;
	case 16:
		internal::__fastpack16(in, out);
		break;
	default:
		throw std::logic_error("Invalid bit width for bitpacking");
	}
}